

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*&,char,int&,char,int&,char,char_const(&)[21]>
          (Exception *this,ostringstream *oss,char **arg,char *args,int *args_1,char *args_2,
          int *args_3,char *args_4,char (*args_5) [21])

{
  char *in_RCX;
  ostringstream *in_RDX;
  ostream *in_RSI;
  int *in_RDI;
  int *in_R8;
  char *in_R9;
  char *unaff_retaddr;
  char (*in_stack_00000008) [21];
  
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,int&,char,int&,char,char_const(&)[21]>
            ((Exception *)in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI,unaff_retaddr,in_stack_00000008);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }